

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall
bssl::SSLTranscript::InitHash(SSLTranscript *this,uint16_t version,SSL_CIPHER *cipher)

{
  bool bVar1;
  EVP_MD *digest;
  EVP_MD *pEVar2;
  env_md_ctx_st *ctx;
  EVP_MD *md;
  SSL_CIPHER *cipher_local;
  uint16_t version_local;
  SSLTranscript *this_local;
  
  this->version_ = version;
  digest = ssl_get_handshake_digest(version,cipher);
  pEVar2 = Digest(this);
  if (pEVar2 == digest) {
    this_local._7_1_ = true;
  }
  else {
    ctx = internal::
          StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
          ::get(&this->hash_);
    bVar1 = HashBuffer(this,ctx,digest);
    if (bVar1) {
      if (((this->field_0x28 & 1) != 0) && (0x303 < this->version_)) {
        FreeBuffer(this);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SSLTranscript::InitHash(uint16_t version, const SSL_CIPHER *cipher) {
  version_ = version;
  const EVP_MD *md = ssl_get_handshake_digest(version, cipher);
  if (Digest() == md) {
    // No need to re-hash the buffer.
    return true;
  }
  if (!HashBuffer(hash_.get(), md)) {
    return false;
  }
  if (is_dtls_ && version_ >= TLS1_3_VERSION) {
    // In DTLS 1.3, prior to the call to InitHash, the message (if present) in
    // the buffer has the DTLS 1.2 header. After the call to InitHash, the TLS
    // 1.3 header is written by SSLTranscript::Update. If the buffer isn't freed
    // here, it would have a mix of different header formats and using it would
    // yield wrong results. However, there's no need for the buffer once the
    // version and the digest for the cipher suite are known, so the buffer is
    // freed here to avoid potential misuse of the SSLTranscript object.
    FreeBuffer();
  }
  return true;
}